

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APInt::reverseBits(APInt *this)

{
  uchar in [1];
  bool bVar1;
  anon_union_8_2_1313ab2f_for_U *paVar2;
  long lVar3;
  uint64_t val;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  uint uVar5;
  byte *in_RSI;
  ulong __n;
  APInt AVar6;
  uchar out [4];
  APInt Val;
  undefined1 uStack_41;
  ushort local_40;
  undefined2 uStack_3e;
  undefined4 uStack_3c;
  anon_union_8_2_1313ab2f_for_U local_38;
  uint local_30;
  
  uVar5 = *(uint *)(in_RSI + 8);
  switch(uVar5 << 0x1d | uVar5 - 8 >> 3) {
  case 0:
    val = (uint64_t)(byte)BitReverseTable256[*in_RSI];
    break;
  case 1:
    paVar2 = &local_38;
    local_38.VAL._0_2_ = *(undefined2 *)in_RSI;
    lVar3 = 1;
    do {
      *(undefined1 *)((long)&local_40 + lVar3) = BitReverseTable256[*(byte *)paVar2];
      paVar2 = (anon_union_8_2_1313ab2f_for_U *)((long)paVar2 + 1);
      lVar3 = lVar3 + -1;
    } while (lVar3 == 0);
    val = (uint64_t)local_40;
    break;
  default:
    local_30 = uVar5;
    if (uVar5 < 0x41) {
      local_38.pVal = *(uint64_t **)in_RSI;
    }
    else {
      __n = (ulong)((uint)((ulong)uVar5 + 0x3f >> 3) & 0xfffffff8);
      local_38.pVal = (uint64_t *)operator_new__(__n);
      memcpy(local_38.pVal,*(void **)in_RSI,__n);
    }
    APInt(this,uVar5,0,false);
    uVar5 = *(uint *)(in_RSI + 8);
    bVar1 = operator==((APInt *)&local_38,0);
    if (!bVar1) {
      do {
        operator<<=(this,1);
        bVar1 = operator[]((APInt *)&local_38,0);
        if (this->BitWidth < 0x41) {
          (this->U).VAL = (this->U).VAL | (ulong)bVar1;
          clearUnusedBits(this);
        }
        else {
          *(this->U).pVal = *(this->U).pVal | (ulong)bVar1;
        }
        uVar5 = uVar5 - 1;
        lshrInPlace((APInt *)&local_38,1);
        bVar1 = operator==((APInt *)&local_38,0);
      } while (!bVar1);
    }
    operator<<=(this,uVar5);
    uVar4 = extraout_RDX_00;
    if ((0x40 < local_30) && ((void *)local_38.VAL != (void *)0x0)) {
      operator_delete__(local_38.pVal);
      uVar4 = extraout_RDX_01;
    }
    goto LAB_001c0196;
  case 3:
    paVar2 = &local_38;
    local_38.VAL._0_4_ = *(undefined4 *)in_RSI;
    lVar3 = 4;
    do {
      (&uStack_41)[lVar3] = BitReverseTable256[*(byte *)paVar2];
      paVar2 = (anon_union_8_2_1313ab2f_for_U *)((long)paVar2 + 1);
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    val = (uint64_t)CONCAT22(uStack_3e,local_40);
    break;
  case 7:
    paVar2 = &local_38;
    local_38.pVal = *(uint64_t **)in_RSI;
    lVar3 = 8;
    do {
      (&uStack_41)[lVar3] = BitReverseTable256[*(byte *)paVar2];
      paVar2 = (anon_union_8_2_1313ab2f_for_U *)((long)paVar2 + 1);
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    val = CONCAT44(uStack_3c,CONCAT22(uStack_3e,local_40));
  }
  APInt(this,uVar5,val,false);
  uVar4 = extraout_RDX;
LAB_001c0196:
  AVar6._8_8_ = uVar4;
  AVar6.U.pVal = (uint64_t *)this;
  return AVar6;
}

Assistant:

APInt APInt::reverseBits() const {
  switch (BitWidth) {
  case 64:
    return APInt(BitWidth, llvm::reverseBits<uint64_t>(U.VAL));
  case 32:
    return APInt(BitWidth, llvm::reverseBits<uint32_t>(U.VAL));
  case 16:
    return APInt(BitWidth, llvm::reverseBits<uint16_t>(U.VAL));
  case 8:
    return APInt(BitWidth, llvm::reverseBits<uint8_t>(U.VAL));
  default:
    break;
  }

  APInt Val(*this);
  APInt Reversed(BitWidth, 0);
  unsigned S = BitWidth;

  for (; Val != 0; Val.lshrInPlace(1)) {
    Reversed <<= 1;
    Reversed |= Val[0];
    --S;
  }

  Reversed <<= S;
  return Reversed;
}